

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O1

BrandedDecl * __thiscall
capnp::compiler::BrandScope::decompileType
          (BrandedDecl *__return_storage_ptr__,BrandScope *this,Resolver *resolver,Reader type)

{
  Reader type_00;
  Reader subSource;
  undefined1 auVar1 [40];
  Reader brand;
  Reader brand_00;
  Reader brand_01;
  BrandScope *pBVar2;
  BrandedDecl *pBVar3;
  size_t sVar4;
  BrandScope *pBVar5;
  undefined4 uVar6;
  undefined2 uVar7;
  short sVar8;
  Which which;
  undefined8 uVar9;
  uint index;
  uint64_t scopeId;
  anon_class_16_2_36210f71 builtin;
  ResolvedDecl decl;
  BrandedDecl elementType;
  anon_class_16_2_36210f71 local_6f0;
  SegmentReader *local_6e0;
  WirePointer *local_6d8;
  CapTableReader *local_6d0;
  undefined1 local_6c8 [16];
  WirePointer *local_6b8;
  WirePointer *pWStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  byte bStack_690;
  undefined7 uStack_68f;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined4 local_658;
  undefined4 uStack_654;
  BrandScope *pBStack_650;
  undefined4 local_648;
  undefined4 uStack_644;
  undefined4 uStack_640;
  undefined4 uStack_63c;
  undefined4 local_638;
  undefined4 uStack_634;
  undefined4 uStack_630;
  undefined4 uStack_62c;
  StructDataBitCount local_628;
  undefined4 uStack_624;
  int iStack_620;
  undefined4 uStack_61c;
  Maybe<capnp::compiler::BrandedDecl> local_618;
  Array<capnp::compiler::BrandedDecl> local_568;
  WirePointer *local_548;
  WirePointer *pWStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  BrandedDecl local_520;
  Exception *local_478;
  CapTableReader *pCStack_470;
  WirePointer *local_468;
  WirePointer *pWStack_460;
  undefined8 local_458;
  Exception *local_448;
  CapTableReader *pCStack_440;
  WirePointer *local_438;
  WirePointer *pWStack_430;
  undefined8 local_428;
  Exception *local_418;
  CapTableReader *pCStack_410;
  WirePointer *local_408;
  WirePointer *pWStack_400;
  undefined8 local_3f8;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined1 local_388 [40];
  byte local_360;
  undefined8 local_358;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined1 local_2f8 [40];
  byte local_2d0;
  undefined8 local_2c8;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined1 local_268 [40];
  byte local_240;
  undefined8 local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  BrandedDecl local_1d0;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  ListReader local_f0;
  ListReader local_c0;
  ListReader local_90;
  StructReader local_60;
  
  if (type._reader.dataSize < 0x10) {
    uVar7 = 0;
  }
  else {
    uVar7 = *type._reader.data;
  }
  local_6f0.resolver = resolver;
  local_6f0.this = this;
  switch(uVar7) {
  case 0:
    which = BUILTIN_VOID;
    break;
  case 1:
    which = BUILTIN_BOOL;
    break;
  case 2:
    which = BUILTIN_INT8;
    break;
  case 3:
    which = BUILTIN_INT16;
    break;
  case 4:
    which = BUILTIN_INT32;
    break;
  case 5:
    which = BUILTIN_INT64;
    break;
  case 6:
    which = BUILTIN_U_INT8;
    break;
  case 7:
    which = BUILTIN_U_INT16;
    break;
  case 8:
    which = BUILTIN_U_INT32;
    break;
  case 9:
    which = BUILTIN_U_INT64;
    break;
  case 10:
    which = BUILTIN_FLOAT32;
    break;
  case 0xb:
    which = BUILTIN_FLOAT64;
    break;
  case 0xc:
    which = BUILTIN_TEXT;
    break;
  case 0xd:
    which = BUILTIN_DATA;
    break;
  case 0xe:
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      type._reader.capTable = (CapTableReader *)0x0;
      type._reader.pointers = (WirePointer *)0x0;
      type._reader.segment = (SegmentReader *)0x0;
    }
    pWStack_6b0 = (WirePointer *)CONCAT44(pWStack_6b0._4_4_,type._reader.nestingLimit);
    local_6c8._0_8_ = type._reader.segment;
    local_6c8._8_8_ = type._reader.capTable;
    local_6b8 = type._reader.pointers;
    capnp::_::PointerReader::getStruct(&local_60,(PointerReader *)local_6c8,(word *)0x0);
    type_00._reader.capTable = local_60.capTable;
    type_00._reader.segment = local_60.segment;
    type_00._reader.data = local_60.data;
    type_00._reader.pointers = local_60.pointers;
    type_00._reader.dataSize = local_60.dataSize;
    type_00._reader.pointerCount = local_60.pointerCount;
    type_00._reader._38_2_ = local_60._38_2_;
    type_00._reader.nestingLimit = local_60.nestingLimit;
    type_00._reader._44_4_ = local_60._44_4_;
    decompileType(&local_1d0,this,resolver,type_00);
    decompileType::anon_class_16_2_36210f71::operator()(&local_520,&local_6f0,BUILTIN_LIST);
    kj::heapArray<capnp::compiler::BrandedDecl>(&local_568,&local_1d0,1);
    local_3c8 = 0;
    local_3d8 = 0;
    uStack_3d0 = 0;
    local_3e8 = 0;
    uStack_3e0 = 0;
    uStack_3c0 = 0x7fffffff;
    auVar1 = ZEXT1640(ZEXT816(0));
    subSource._reader._40_8_ = 0x7fffffff;
    subSource._reader.segment = (SegmentReader *)auVar1._0_8_;
    subSource._reader.capTable = (CapTableReader *)auVar1._8_8_;
    subSource._reader.data = (void *)auVar1._16_8_;
    subSource._reader.pointers = (WirePointer *)auVar1._24_8_;
    subSource._reader.dataSize = auVar1._32_4_;
    subSource._reader.pointerCount = auVar1._36_2_;
    subSource._reader._38_2_ = auVar1._38_2_;
    BrandedDecl::applyParams(&local_618,&local_520,&local_568,subSource);
    sVar4 = local_568.size_;
    pBVar3 = local_568.ptr;
    uVar9 = local_618.ptr.field_1.value.brand.ptr;
    local_6c8[0] = local_618.ptr.isSet;
    if (local_618.ptr.isSet == true) {
      local_6c8._8_4_ = local_618.ptr.field_1.value.body.tag;
      if (local_618.ptr.field_1.value.body.tag == 2) {
        local_6b8 = (WirePointer *)local_618.ptr.field_1._8_8_;
        pWStack_6b0 = (WirePointer *)local_618.ptr.field_1._16_8_;
      }
      else if (local_618.ptr.field_1.value.body.tag == 1) {
        local_698 = local_618.ptr.field_1._40_8_;
        local_6a8 = CONCAT26(local_618.ptr.field_1._30_2_,
                             CONCAT24(local_618.ptr.field_1._28_2_,local_618.ptr.field_1._24_4_));
        uStack_6a0 = CONCAT44(local_618.ptr.field_1._36_4_,local_618.ptr.field_1._32_4_);
        local_6b8 = (WirePointer *)local_618.ptr.field_1._8_8_;
        pWStack_6b0 = (WirePointer *)local_618.ptr.field_1._16_8_;
        bStack_690 = local_618.ptr.field_1._48_1_;
        if (local_618.ptr.field_1._48_1_ == 1) {
          local_668 = local_618.ptr.field_1._88_8_;
          uStack_660 = local_618.ptr.field_1._96_8_;
          local_678 = local_618.ptr.field_1._72_8_;
          uStack_670 = local_618.ptr.field_1._80_8_;
          local_688 = local_618.ptr.field_1._56_8_;
          uStack_680 = local_618.ptr.field_1._64_8_;
          local_618.ptr.field_1._48_1_ = 0;
        }
      }
      local_618.ptr.field_1.value.brand.ptr = (BrandScope *)0x0;
      uStack_61c = local_618.ptr.field_1._164_4_;
      iStack_620 = local_618.ptr.field_1.value.source._reader.nestingLimit;
      uStack_624 = local_618.ptr.field_1._156_4_;
      local_628 = local_618.ptr.field_1.value.source._reader.dataSize;
      uStack_62c = local_618.ptr.field_1._148_4_;
      uStack_630 = local_618.ptr.field_1._144_4_;
      uStack_634 = local_618.ptr.field_1._140_4_;
      local_638 = local_618.ptr.field_1._136_4_;
      uStack_63c = local_618.ptr.field_1._132_4_;
      uStack_640 = local_618.ptr.field_1._128_4_;
      uStack_644 = local_618.ptr.field_1._124_4_;
      local_648 = local_618.ptr.field_1._120_4_;
      pBStack_650 = (BrandScope *)uVar9;
      uStack_654 = local_618.ptr.field_1._108_4_;
      local_658 = local_618.ptr.field_1._104_4_;
      uVar6 = local_618.ptr.field_1.value.body.tag;
      if (local_618.ptr.field_1.value.body.tag == 1) {
        uVar6 = 0;
      }
      if (uVar6 == 2) {
        uVar6 = 0;
      }
      local_618.ptr.field_1.value.body.tag = uVar6;
    }
    if (local_568.ptr != (BrandedDecl *)0x0) {
      local_568.ptr = (BrandedDecl *)0x0;
      local_568.size_ = 0;
      (*(code *)**(undefined8 **)local_568.disposer)
                (local_568.disposer,pBVar3,0xa8,sVar4,sVar4,
                 kj::ArrayDisposer::Dispose_<capnp::compiler::BrandedDecl>::destruct);
    }
    pBVar2 = local_520.brand.ptr;
    if (local_520.brand.ptr != (BrandScope *)0x0) {
      local_520.brand.ptr = (BrandScope *)0x0;
      (**(local_520.brand.disposer)->_vptr_Disposer)
                (local_520.brand.disposer,
                 (_func_int *)
                 ((long)&(pBVar2->super_Refcounted).super_Disposer._vptr_Disposer +
                 (long)(pBVar2->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
    }
    pBVar5 = local_1d0.brand.ptr;
    pBVar2 = pBStack_650;
    if (local_520.body.tag == 1) {
      local_520.body._0_8_ = local_520.body._0_8_ & 0xffffffff00000000;
    }
    if (local_520.body.tag == 2) {
      local_520.body._0_8_ = local_520.body._0_8_ & 0xffffffff00000000;
    }
    if (local_6c8[0] != '\0') {
      uVar6 = local_6c8._8_4_;
      if (local_6c8._8_4_ == 2) {
        local_548 = local_6b8;
        pWStack_540 = pWStack_6b0;
      }
      else if (local_6c8._8_4_ == 1) {
        local_528 = local_698;
        local_538 = local_6a8;
        uStack_530 = uStack_6a0;
        local_548 = local_6b8;
        pWStack_540 = pWStack_6b0;
        resolver = (Resolver *)(ulong)bStack_690;
        if (bStack_690 == 1) {
          local_100 = local_668;
          uStack_f8 = uStack_660;
          local_110 = local_678;
          uStack_108 = uStack_670;
          local_120 = local_688;
          uStack_118 = uStack_680;
          bStack_690 = 0;
        }
      }
      if (local_6c8[0] != '\0') {
        if (local_6c8._8_4_ == 1) {
          local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffff00000000;
        }
        if (local_6c8._8_4_ == 2) {
          local_6c8._8_8_ = local_6c8._8_8_ & 0xffffffff00000000;
        }
      }
      pBStack_650 = (BrandScope *)0x0;
      (__return_storage_ptr__->body).tag = uVar6;
      if (uVar6 == 2) {
        *(WirePointer **)&(__return_storage_ptr__->body).field_1 = local_548;
        *(WirePointer **)((long)&(__return_storage_ptr__->body).field_1 + 8) = pWStack_540;
      }
      else if (uVar6 == 1) {
        *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) = local_528;
        *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x10) = local_538;
        *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = uStack_530;
        *(WirePointer **)&(__return_storage_ptr__->body).field_1 = local_548;
        *(WirePointer **)((long)&(__return_storage_ptr__->body).field_1 + 8) = pWStack_540;
        (__return_storage_ptr__->body).field_1.space[0x28] = (byte)resolver;
        if (((ulong)resolver & 1) != 0) {
          *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x50) = local_100;
          *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x58) = uStack_f8;
          *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x40) = local_110;
          *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x48) = uStack_108;
          *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x30) = local_120;
          *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x38) = uStack_118;
        }
      }
      (__return_storage_ptr__->brand).disposer = (Disposer *)CONCAT44(uStack_654,local_658);
      (__return_storage_ptr__->brand).ptr = pBVar2;
      (__return_storage_ptr__->source)._reader.dataSize = local_628;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.pointerCount = uStack_624;
      (__return_storage_ptr__->source)._reader.nestingLimit = iStack_620;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.field_0x2c = uStack_61c;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.data = local_638;
      *(undefined4 *)((long)&(__return_storage_ptr__->source)._reader.data + 4) = uStack_634;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.pointers = uStack_630;
      *(undefined4 *)((long)&(__return_storage_ptr__->source)._reader.pointers + 4) = uStack_62c;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.segment = local_648;
      *(undefined4 *)((long)&(__return_storage_ptr__->source)._reader.segment + 4) = uStack_644;
      *(undefined4 *)&(__return_storage_ptr__->source)._reader.capTable = uStack_640;
      *(undefined4 *)((long)&(__return_storage_ptr__->source)._reader.capTable + 4) = uStack_63c;
      if (local_1d0.brand.ptr == (BrandScope *)0x0) {
        return __return_storage_ptr__;
      }
      local_1d0.brand.ptr = (BrandScope *)0x0;
      (**(local_1d0.brand.disposer)->_vptr_Disposer)
                (local_1d0.brand.disposer,
                 (_func_int *)
                 ((long)&(pBVar5->super_Refcounted).super_Disposer._vptr_Disposer +
                 (long)(pBVar5->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
      return __return_storage_ptr__;
    }
    local_520.body.tag = 0;
    local_520.body._4_4_ = 0;
    local_618.ptr._0_8_ = (SegmentReader *)0x0;
    local_618.ptr.field_1._0_8_ = (CapTableReader *)0x0;
    kj::_::Debug::Fault::init
              ((Fault *)&local_520,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.c++"
              );
    kj::_::Debug::Fault::fatal((Fault *)&local_520);
  case 0xf:
    if (type._reader.dataSize < 0x80) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(undefined8 *)((long)type._reader.data + 8);
    }
    local_6e0 = type._reader.segment;
    local_6d0 = type._reader.capTable;
    local_6d8 = type._reader.pointers;
    (*resolver->_vptr_Resolver[3])(local_6c8,resolver,uVar9);
    local_3f8 = local_6a8;
    local_408 = local_6b8;
    pWStack_400 = pWStack_6b0;
    local_418 = (Exception *)local_6c8._0_8_;
    pCStack_410 = (CapTableReader *)local_6c8._8_8_;
    if ((byte)uStack_6a0 == '\x01') {
      local_1e8 = local_678;
      uStack_1e0 = uStack_670;
      local_1f8 = local_688;
      uStack_1f0 = uStack_680;
      uStack_200 = CONCAT71(uStack_68f,bStack_690);
      local_208 = local_698;
      local_238 = local_698;
      local_228 = local_688;
      uStack_220 = uStack_680;
      local_218 = local_678;
      uStack_210 = uStack_670;
    }
    local_240 = (byte)uStack_6a0;
    local_1d0.body.field_1._0_8_ = local_6d0;
    local_1d0.body.field_1._8_8_ = local_6d8;
    local_1d0.body._0_8_ = local_6e0;
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      local_1d0.body.field_1._0_8_ = (CapTableReader *)0x0;
      local_1d0.body.field_1._8_8_ = (WirePointer *)0x0;
      local_1d0.body._0_8_ = (SegmentReader *)0x0;
    }
    local_1d0.body.field_1._16_4_ = type._reader.nestingLimit;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_618,(PointerReader *)&local_1d0,(word *)0x0);
    if (local_618.ptr.field_1._28_2_ == 0) {
      local_618.ptr.field_1._32_4_ = 0x7fffffff;
      local_618.ptr.field_1._0_8_ = (CapTableReader *)0x0;
      local_618.ptr.field_1._16_8_ = (WirePointer *)0x0;
      local_618.ptr._0_8_ = (SegmentReader *)0x0;
    }
    local_1d0.body._0_8_ = local_618.ptr._0_8_;
    local_1d0.body.field_1._0_8_ = local_618.ptr.field_1._0_8_;
    local_1d0.body.field_1._8_8_ = local_618.ptr.field_1._16_8_;
    local_1d0.body.field_1._16_4_ = local_618.ptr.field_1._32_4_;
    capnp::_::PointerReader::getList
              (&local_90,(PointerReader *)&local_1d0,INLINE_COMPOSITE,(word *)0x0);
    brand_00.reader.capTable = local_90.capTable;
    brand_00.reader.segment = local_90.segment;
    brand_00.reader.ptr = local_90.ptr;
    brand_00.reader.elementCount = local_90.elementCount;
    brand_00.reader.step = local_90.step;
    brand_00.reader.structDataSize = local_90.structDataSize;
    brand_00.reader.structPointerCount = local_90.structPointerCount;
    brand_00.reader.elementSize = local_90.elementSize;
    brand_00.reader._39_1_ = local_90._39_1_;
    brand_00.reader.nestingLimit = local_90.nestingLimit;
    brand_00.reader._44_4_ = local_90._44_4_;
    evaluateBrand((BrandScope *)&local_520,(Resolver *)this,(ResolvedDecl *)resolver,brand_00,
                  (uint)local_268);
    (__return_storage_ptr__->source)._reader.data = (void *)0x0;
    (__return_storage_ptr__->source)._reader.pointers = (WirePointer *)0x0;
    (__return_storage_ptr__->source)._reader.segment = (SegmentReader *)0x0;
    (__return_storage_ptr__->source)._reader.capTable = (CapTableReader *)0x0;
    (__return_storage_ptr__->source)._reader.dataSize = 0;
    (__return_storage_ptr__->source)._reader.pointerCount = 0;
    *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = 0;
    (__return_storage_ptr__->body).tag = 0;
    (__return_storage_ptr__->brand).disposer = (Disposer *)local_520.body._0_8_;
    (__return_storage_ptr__->brand).ptr = (BrandScope *)local_520.body.field_1._0_8_;
    *(undefined8 *)&(__return_storage_ptr__->source)._reader.nestingLimit = 0x7fffffff;
    *(Exception **)&(__return_storage_ptr__->body).field_1 = local_418;
    *(CapTableReader **)((long)&(__return_storage_ptr__->body).field_1 + 8) = pCStack_410;
    *(WirePointer **)((long)&(__return_storage_ptr__->body).field_1 + 0x10) = local_408;
    *(WirePointer **)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = pWStack_400;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) = local_3f8;
    (__return_storage_ptr__->body).field_1.space[0x28] = (byte)uStack_6a0;
    if ((byte)uStack_6a0 == '\0') goto LAB_001270ce;
    local_298._0_4_ = (undefined4)local_208;
    local_298._4_4_ = local_208._4_4_;
    uStack_290._0_4_ = (undefined4)uStack_200;
    uStack_290._4_4_ = uStack_200._4_4_;
    local_288._0_4_ = (undefined4)local_1f8;
    local_288._4_4_ = local_1f8._4_4_;
    uStack_280._0_4_ = (undefined4)uStack_1f0;
    uStack_280._4_4_ = uStack_1f0._4_4_;
    local_278._0_4_ = (undefined4)local_1e8;
    local_278._4_4_ = local_1e8._4_4_;
    uStack_270._0_4_ = (undefined4)uStack_1e0;
    uStack_270._4_4_ = uStack_1e0._4_4_;
    goto LAB_001270c2;
  case 0x10:
    if (type._reader.dataSize < 0x80) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(undefined8 *)((long)type._reader.data + 8);
    }
    local_6e0 = type._reader.segment;
    local_6d0 = type._reader.capTable;
    local_6d8 = type._reader.pointers;
    (*resolver->_vptr_Resolver[3])(local_6c8,resolver,uVar9);
    local_458 = local_6a8;
    local_468 = local_6b8;
    pWStack_460 = pWStack_6b0;
    local_478 = (Exception *)local_6c8._0_8_;
    pCStack_470 = (CapTableReader *)local_6c8._8_8_;
    if ((byte)uStack_6a0 == '\x01') {
      local_308 = local_678;
      uStack_300 = uStack_670;
      local_318 = local_688;
      uStack_310 = uStack_680;
      uStack_320 = CONCAT71(uStack_68f,bStack_690);
      local_328 = local_698;
      local_358 = local_698;
      local_348 = local_688;
      uStack_340 = uStack_680;
      local_338 = local_678;
      uStack_330 = uStack_670;
    }
    local_360 = (byte)uStack_6a0;
    local_1d0.body.field_1._0_8_ = local_6d0;
    local_1d0.body.field_1._8_8_ = local_6d8;
    local_1d0.body._0_8_ = local_6e0;
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      local_1d0.body.field_1._0_8_ = (CapTableReader *)0x0;
      local_1d0.body.field_1._8_8_ = (WirePointer *)0x0;
      local_1d0.body._0_8_ = (SegmentReader *)0x0;
    }
    local_1d0.body.field_1._16_4_ = type._reader.nestingLimit;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_618,(PointerReader *)&local_1d0,(word *)0x0);
    if (local_618.ptr.field_1._28_2_ == 0) {
      local_618.ptr.field_1._32_4_ = 0x7fffffff;
      local_618.ptr.field_1._0_8_ = (CapTableReader *)0x0;
      local_618.ptr.field_1._16_8_ = (WirePointer *)0x0;
      local_618.ptr._0_8_ = (SegmentReader *)0x0;
    }
    local_1d0.body._0_8_ = local_618.ptr._0_8_;
    local_1d0.body.field_1._0_8_ = local_618.ptr.field_1._0_8_;
    local_1d0.body.field_1._8_8_ = local_618.ptr.field_1._16_8_;
    local_1d0.body.field_1._16_4_ = local_618.ptr.field_1._32_4_;
    capnp::_::PointerReader::getList
              (&local_f0,(PointerReader *)&local_1d0,INLINE_COMPOSITE,(word *)0x0);
    brand.reader.capTable = local_f0.capTable;
    brand.reader.segment = local_f0.segment;
    brand.reader.ptr = local_f0.ptr;
    brand.reader.elementCount = local_f0.elementCount;
    brand.reader.step = local_f0.step;
    brand.reader.structDataSize = local_f0.structDataSize;
    brand.reader.structPointerCount = local_f0.structPointerCount;
    brand.reader.elementSize = local_f0.elementSize;
    brand.reader._39_1_ = local_f0._39_1_;
    brand.reader.nestingLimit = local_f0.nestingLimit;
    brand.reader._44_4_ = local_f0._44_4_;
    evaluateBrand((BrandScope *)&local_520,(Resolver *)this,(ResolvedDecl *)resolver,brand,
                  (uint)local_388);
    (__return_storage_ptr__->source)._reader.data = (void *)0x0;
    (__return_storage_ptr__->source)._reader.pointers = (WirePointer *)0x0;
    (__return_storage_ptr__->source)._reader.segment = (SegmentReader *)0x0;
    (__return_storage_ptr__->source)._reader.capTable = (CapTableReader *)0x0;
    (__return_storage_ptr__->source)._reader.dataSize = 0;
    (__return_storage_ptr__->source)._reader.pointerCount = 0;
    *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = 0;
    (__return_storage_ptr__->body).tag = 0;
    (__return_storage_ptr__->brand).disposer = (Disposer *)local_520.body._0_8_;
    (__return_storage_ptr__->brand).ptr = (BrandScope *)local_520.body.field_1._0_8_;
    *(undefined8 *)&(__return_storage_ptr__->source)._reader.nestingLimit = 0x7fffffff;
    *(Exception **)&(__return_storage_ptr__->body).field_1 = local_478;
    *(CapTableReader **)((long)&(__return_storage_ptr__->body).field_1 + 8) = pCStack_470;
    *(WirePointer **)((long)&(__return_storage_ptr__->body).field_1 + 0x10) = local_468;
    *(WirePointer **)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = pWStack_460;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) = local_458;
    (__return_storage_ptr__->body).field_1.space[0x28] = (byte)uStack_6a0;
    if ((byte)uStack_6a0 == '\0') goto LAB_001270ce;
    local_298._0_4_ = (undefined4)local_328;
    local_298._4_4_ = local_328._4_4_;
    uStack_290._0_4_ = (undefined4)uStack_320;
    uStack_290._4_4_ = uStack_320._4_4_;
    local_288._0_4_ = (undefined4)local_318;
    local_288._4_4_ = local_318._4_4_;
    uStack_280._0_4_ = (undefined4)uStack_310;
    uStack_280._4_4_ = uStack_310._4_4_;
    local_278._0_4_ = (undefined4)local_308;
    local_278._4_4_ = local_308._4_4_;
    uStack_270._0_4_ = (undefined4)uStack_300;
    uStack_270._4_4_ = uStack_300._4_4_;
    goto LAB_001270c2;
  case 0x11:
    if (type._reader.dataSize < 0x80) {
      uVar9 = 0;
    }
    else {
      uVar9 = *(undefined8 *)((long)type._reader.data + 8);
    }
    local_6e0 = type._reader.segment;
    local_6d0 = type._reader.capTable;
    local_6d8 = type._reader.pointers;
    (*resolver->_vptr_Resolver[3])(local_6c8,resolver,uVar9);
    local_428 = local_6a8;
    local_438 = local_6b8;
    pWStack_430 = pWStack_6b0;
    local_448 = (Exception *)local_6c8._0_8_;
    pCStack_440 = (CapTableReader *)local_6c8._8_8_;
    if ((byte)uStack_6a0 == '\x01') {
      local_278 = local_678;
      uStack_270 = uStack_670;
      local_288 = local_688;
      uStack_280 = uStack_680;
      uStack_290 = CONCAT71(uStack_68f,bStack_690);
      local_298 = local_698;
      local_2c8 = local_698;
      local_2b8 = local_688;
      uStack_2b0 = uStack_680;
      local_2a8 = local_678;
      uStack_2a0 = uStack_670;
    }
    local_2d0 = (byte)uStack_6a0;
    local_1d0.body.field_1._0_8_ = local_6d0;
    local_1d0.body.field_1._8_8_ = local_6d8;
    local_1d0.body._0_8_ = local_6e0;
    if (type._reader.pointerCount == 0) {
      type._reader.nestingLimit = 0x7fffffff;
      local_1d0.body.field_1._0_8_ = (CapTableReader *)0x0;
      local_1d0.body.field_1._8_8_ = (WirePointer *)0x0;
      local_1d0.body._0_8_ = (SegmentReader *)0x0;
    }
    local_1d0.body.field_1._16_4_ = type._reader.nestingLimit;
    capnp::_::PointerReader::getStruct
              ((StructReader *)&local_618,(PointerReader *)&local_1d0,(word *)0x0);
    if (local_618.ptr.field_1._28_2_ == 0) {
      local_618.ptr.field_1._32_4_ = 0x7fffffff;
      local_618.ptr.field_1._0_8_ = (CapTableReader *)0x0;
      local_618.ptr.field_1._16_8_ = (WirePointer *)0x0;
      local_618.ptr._0_8_ = (SegmentReader *)0x0;
    }
    local_1d0.body._0_8_ = local_618.ptr._0_8_;
    local_1d0.body.field_1._0_8_ = local_618.ptr.field_1._0_8_;
    local_1d0.body.field_1._8_8_ = local_618.ptr.field_1._16_8_;
    local_1d0.body.field_1._16_4_ = local_618.ptr.field_1._32_4_;
    capnp::_::PointerReader::getList
              (&local_c0,(PointerReader *)&local_1d0,INLINE_COMPOSITE,(word *)0x0);
    brand_01.reader.capTable = local_c0.capTable;
    brand_01.reader.segment = local_c0.segment;
    brand_01.reader.ptr = local_c0.ptr;
    brand_01.reader.elementCount = local_c0.elementCount;
    brand_01.reader.step = local_c0.step;
    brand_01.reader.structDataSize = local_c0.structDataSize;
    brand_01.reader.structPointerCount = local_c0.structPointerCount;
    brand_01.reader.elementSize = local_c0.elementSize;
    brand_01.reader._39_1_ = local_c0._39_1_;
    brand_01.reader.nestingLimit = local_c0.nestingLimit;
    brand_01.reader._44_4_ = local_c0._44_4_;
    evaluateBrand((BrandScope *)&local_520,(Resolver *)this,(ResolvedDecl *)resolver,brand_01,
                  (uint)local_2f8);
    (__return_storage_ptr__->source)._reader.data = (void *)0x0;
    (__return_storage_ptr__->source)._reader.pointers = (WirePointer *)0x0;
    (__return_storage_ptr__->source)._reader.segment = (SegmentReader *)0x0;
    (__return_storage_ptr__->source)._reader.capTable = (CapTableReader *)0x0;
    (__return_storage_ptr__->source)._reader.dataSize = 0;
    (__return_storage_ptr__->source)._reader.pointerCount = 0;
    *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = 0;
    (__return_storage_ptr__->body).tag = 0;
    (__return_storage_ptr__->brand).disposer = (Disposer *)local_520.body._0_8_;
    (__return_storage_ptr__->brand).ptr = (BrandScope *)local_520.body.field_1._0_8_;
    *(undefined8 *)&(__return_storage_ptr__->source)._reader.nestingLimit = 0x7fffffff;
    *(Exception **)&(__return_storage_ptr__->body).field_1 = local_448;
    *(CapTableReader **)((long)&(__return_storage_ptr__->body).field_1 + 8) = pCStack_440;
    *(WirePointer **)((long)&(__return_storage_ptr__->body).field_1 + 0x10) = local_438;
    *(WirePointer **)((long)&(__return_storage_ptr__->body).field_1 + 0x18) = pWStack_430;
    *(undefined8 *)((long)&(__return_storage_ptr__->body).field_1 + 0x20) = local_428;
    (__return_storage_ptr__->body).field_1.space[0x28] = (byte)uStack_6a0;
    if ((byte)uStack_6a0 == '\0') goto LAB_001270ce;
LAB_001270c2:
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x50) = (undefined4)local_278;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x54) = local_278._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x58) = (undefined4)uStack_270;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x5c) = uStack_270._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x40) = (undefined4)local_288;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x44) = local_288._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x48) = (undefined4)uStack_280;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x4c) = uStack_280._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x30) = (undefined4)local_298;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x34) = local_298._4_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x38) = (undefined4)uStack_290;
    *(undefined4 *)((long)&(__return_storage_ptr__->body).field_1 + 0x3c) = uStack_290._4_4_;
LAB_001270ce:
    (__return_storage_ptr__->body).tag = 1;
    return __return_storage_ptr__;
  case 0x12:
    if (type._reader.dataSize < 0x50) {
      sVar8 = 0;
    }
    else {
      sVar8 = *(short *)((long)type._reader.data + 8);
    }
    if (sVar8 != 0) {
      if (sVar8 == 1) {
        index = 0;
        if (type._reader.dataSize < 0xc0) {
          scopeId = 0;
        }
        else {
          scopeId = *(uint64_t *)((long)type._reader.data + 0x10);
        }
        if (0x5f < type._reader.dataSize) {
          index = (uint)*(ushort *)((long)type._reader.data + 10);
        }
        lookupParameter(&local_618,this,resolver,scopeId,index);
        uVar9 = local_618.ptr.field_1.value.brand.ptr;
        local_6c8[0] = local_618.ptr.isSet;
        if (local_618.ptr.isSet == true) {
          local_6c8._8_4_ = local_618.ptr.field_1.value.body.tag;
          if (local_618.ptr.field_1.value.body.tag == 2) {
            local_6b8 = (WirePointer *)local_618.ptr.field_1._8_8_;
            pWStack_6b0 = (WirePointer *)local_618.ptr.field_1._16_8_;
          }
          else if (local_618.ptr.field_1.value.body.tag == 1) {
            local_698 = local_618.ptr.field_1._40_8_;
            local_6b8 = (WirePointer *)local_618.ptr.field_1._8_8_;
            pWStack_6b0 = (WirePointer *)local_618.ptr.field_1._16_8_;
            bStack_690 = local_618.ptr.field_1._48_1_;
            if (local_618.ptr.field_1._48_1_ == 1) {
              local_668 = local_618.ptr.field_1._88_8_;
              uStack_660 = local_618.ptr.field_1._96_8_;
              local_678 = local_618.ptr.field_1._72_8_;
              uStack_670 = local_618.ptr.field_1._80_8_;
              local_688 = local_618.ptr.field_1._56_8_;
              uStack_680 = local_618.ptr.field_1._64_8_;
              local_618.ptr.field_1._48_1_ = 0;
            }
          }
          local_618.ptr.field_1.value.brand.ptr = (BrandScope *)0x0;
          pBStack_650 = (BrandScope *)uVar9;
          uStack_654 = local_618.ptr.field_1._108_4_;
          local_658 = local_618.ptr.field_1._104_4_;
          uVar6 = local_618.ptr.field_1.value.body.tag;
          if (local_618.ptr.field_1.value.body.tag == 1) {
            uVar6 = 0;
          }
          if (uVar6 == 2) {
            uVar6 = 0;
          }
          local_618.ptr.field_1.value.body.tag = uVar6;
        }
        if (local_618.ptr.isSet == true) {
          BrandedDecl::BrandedDecl(__return_storage_ptr__,(BrandedDecl *)(local_6c8 + 8));
        }
        else {
          (__return_storage_ptr__->brand).disposer = (Disposer *)0x0;
          (__return_storage_ptr__->brand).ptr = (BrandScope *)0x0;
          (__return_storage_ptr__->source)._reader.segment = (SegmentReader *)0x0;
          (__return_storage_ptr__->source)._reader.capTable = (CapTableReader *)0x0;
          (__return_storage_ptr__->source)._reader.data = (void *)0x0;
          (__return_storage_ptr__->source)._reader.pointers = (WirePointer *)0x0;
          (__return_storage_ptr__->source)._reader.dataSize = 0;
          (__return_storage_ptr__->source)._reader.pointerCount = 0;
          *(undefined2 *)&(__return_storage_ptr__->source)._reader.field_0x26 = 0;
          *(undefined8 *)&(__return_storage_ptr__->source)._reader.nestingLimit = 0x7fffffff;
          *(uint64_t *)&(__return_storage_ptr__->body).field_1 = scopeId;
          *(uint *)((long)&(__return_storage_ptr__->body).field_1 + 8) = index;
          (__return_storage_ptr__->body).tag = 2;
        }
        pBVar2 = pBStack_650;
        if (local_6c8[0] != '\x01') {
          return __return_storage_ptr__;
        }
        if (pBStack_650 == (BrandScope *)0x0) {
          return __return_storage_ptr__;
        }
        pBStack_650 = (BrandScope *)0x0;
        (*(code *)**(undefined8 **)CONCAT44(uStack_654,local_658))
                  ((undefined8 *)CONCAT44(uStack_654,local_658),
                   (_func_int *)
                   ((long)&(pBVar2->super_Refcounted).super_Disposer._vptr_Disposer +
                   (long)(pBVar2->super_Refcounted).super_Disposer._vptr_Disposer[-2]));
        return __return_storage_ptr__;
      }
      if (sVar8 == 2) {
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                  ((Fault *)local_6c8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/generics.c++"
                   ,0x208,FAILED,(char *)0x0,"\"Alias pointed to implicit method type parameter?\"",
                   (char (*) [49])"Alias pointed to implicit method type parameter?");
        kj::_::Debug::Fault::fatal((Fault *)local_6c8);
      }
      goto switchD_001261ce_default;
    }
    which = BUILTIN_ANY_POINTER;
    break;
  default:
switchD_001261ce_default:
    kj::_::unreachable();
  }
  decompileType::anon_class_16_2_36210f71::operator()(__return_storage_ptr__,&local_6f0,which);
  return __return_storage_ptr__;
}

Assistant:

BrandedDecl BrandScope::decompileType(
    Resolver& resolver, schema::Type::Reader type) {
  auto builtin = [&](Declaration::Which which) -> BrandedDecl {
    auto decl = resolver.resolveBuiltin(which);
    return BrandedDecl(decl,
        evaluateBrand(resolver, decl, List<schema::Brand::Scope>::Reader()),
        Expression::Reader());
  };

  switch (type.which()) {
    case schema::Type::VOID:    return builtin(Declaration::BUILTIN_VOID);
    case schema::Type::BOOL:    return builtin(Declaration::BUILTIN_BOOL);
    case schema::Type::INT8:    return builtin(Declaration::BUILTIN_INT8);
    case schema::Type::INT16:   return builtin(Declaration::BUILTIN_INT16);
    case schema::Type::INT32:   return builtin(Declaration::BUILTIN_INT32);
    case schema::Type::INT64:   return builtin(Declaration::BUILTIN_INT64);
    case schema::Type::UINT8:   return builtin(Declaration::BUILTIN_U_INT8);
    case schema::Type::UINT16:  return builtin(Declaration::BUILTIN_U_INT16);
    case schema::Type::UINT32:  return builtin(Declaration::BUILTIN_U_INT32);
    case schema::Type::UINT64:  return builtin(Declaration::BUILTIN_U_INT64);
    case schema::Type::FLOAT32: return builtin(Declaration::BUILTIN_FLOAT32);
    case schema::Type::FLOAT64: return builtin(Declaration::BUILTIN_FLOAT64);
    case schema::Type::TEXT:    return builtin(Declaration::BUILTIN_TEXT);
    case schema::Type::DATA:    return builtin(Declaration::BUILTIN_DATA);

    case schema::Type::ENUM: {
      auto enumType = type.getEnum();
      Resolver::ResolvedDecl decl = resolver.resolveId(enumType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, enumType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = type.getInterface();
      Resolver::ResolvedDecl decl = resolver.resolveId(interfaceType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, interfaceType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::STRUCT: {
      auto structType = type.getStruct();
      Resolver::ResolvedDecl decl = resolver.resolveId(structType.getTypeId());
      return BrandedDecl(decl,
          evaluateBrand(resolver, decl, structType.getBrand().getScopes()),
          Expression::Reader());
    }

    case schema::Type::LIST: {
      auto elementType = decompileType(resolver, type.getList().getElementType());
      return KJ_ASSERT_NONNULL(builtin(Declaration::BUILTIN_LIST)
          .applyParams(kj::heapArray(&elementType, 1), Expression::Reader()));
    }

    case schema::Type::ANY_POINTER: {
      auto anyPointer = type.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return builtin(Declaration::BUILTIN_ANY_POINTER);

        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          auto id = param.getScopeId();
          uint index = param.getParameterIndex();
          KJ_IF_SOME(binding, lookupParameter(resolver, id, index)) {
            return binding;
          } else {
            return BrandedDecl(Resolver::ResolvedParameter {id, index}, Expression::Reader());
          }
        }

        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          KJ_FAIL_ASSERT("Alias pointed to implicit method type parameter?");
      }

      KJ_UNREACHABLE;
    }
  }